

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId callApplyCallSiteId)

{
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar1;
  code *pcVar2;
  bool bVar3;
  ProfileId PVar4;
  FunctionCodeGenRuntimeData *in_RAX;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_28;
  
  local_28.ptr = in_RAX;
  PVar4 = FunctionBody::GetProfiledCallApplyCallSiteCount((this->functionBody).ptr);
  if (PVar4 <= callApplyCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xc5,
                                "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                ,
                                "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pWVar1 = (this->callApplyTargetInlinees).ptr;
  if (pWVar1 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    local_28.ptr = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
              (&local_28,pWVar1 + callApplyCallSiteId);
  }
  return local_28.ptr;
}

Assistant:

const FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee(const ProfileId callApplyCallSiteId) const
    {
        Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());

        return callApplyTargetInlinees ? callApplyTargetInlinees[callApplyCallSiteId] : nullptr;
    }